

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_advanced.hpp
# Opt level: O1

void __thiscall
LDPC4QKD::
FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
::encode_qc(FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>
            *this,span<const_unsigned_char,_4096UL> in,span<unsigned_char,_2048UL> out)

{
  ushort uVar1;
  size_t col;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  col = 0;
  do {
    uVar2 = col >> 5;
    uVar1 = (this->colptr)._M_elems[uVar2];
    uVar3 = (ulong)uVar1;
    if (uVar1 < (this->colptr)._M_elems[uVar2 + 1]) {
      do {
        uVar4 = (int)col - (uint)(this->values)._M_elems[uVar3] & 0x1f |
                (uint)(this->row_idx)._M_elems[uVar3] << 5;
        out._M_ptr[uVar4] = (in._M_ptr[col] != '\0') != (out._M_ptr[uVar4] != '\0');
        uVar3 = uVar3 + 1;
      } while (uVar3 < (this->colptr)._M_elems[uVar2 + 1]);
    }
    col = col + 1;
  } while (col != 0x1000);
  return;
}

Assistant:

void encode_qc(
                std::span<bit_type const, N * expansion_factor> in,
                std::span<bit_type, M * expansion_factor> out) const {

            static_assert(N >= M, "The syndrome should be shorter than the input bitstring.");

            for (std::size_t col = 0; col < in.size(); col++) {
                auto QCcol = col / expansion_factor;  // column index into matrix of exponents
                for (std::size_t j = colptr[QCcol]; j < colptr[QCcol + 1]; j++) {
                    auto shiftVal = values[j];
                    auto QCrow = row_idx[j];  // row index into matrix of exponents
                    // computes `outIdx`, which is the unique row index (into full matrix) at which there is a `1`
                    // arising from the current sub-block.
                    // The sub-block is determined by the QC-exponent `shiftVal`.
                    // Add the base row-index of the current sub-block to the shift
                    auto outIdx = (expansion_factor * QCrow) + ((col - shiftVal) % expansion_factor);

                    out[outIdx] = xor_as_bools(out[outIdx], in[col]);
                }
            }
        }